

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::isVarCanBeString(Analyzer *this,Node *node)

{
  NodeType NVar1;
  Node *pNVar2;
  int iVar3;
  ulong uVar4;
  Node *a;
  long lVar5;
  bool bVar6;
  
  while( true ) {
    a = node;
    bVar6 = a != (Node *)0x0;
    if (!bVar6) {
      return bVar6;
    }
    NVar1 = a->nodeType;
    if (NVar1 != PNT_BINARY_OP) break;
    if ((a->tok->type != TK_NULLCOALESCE) ||
       (node = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start, node->nodeType != PNT_STRING)) goto LAB_0011fd08;
  }
  if (NVar1 == PNT_STRING) {
    return bVar6;
  }
  if (NVar1 == PNT_FUNCTION_CALL) {
    pNVar2 = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pNVar2->nodeType == PNT_IDENTIFIER) {
      iVar3 = strcmp((pNVar2->tok->u).s,"loc");
      if (iVar3 == 0) {
        return true;
      }
    }
    else if (((pNVar2->nodeType == PNT_ACCESS_MEMBER) &&
             (lVar5 = *(long *)(*(long *)&(pNVar2->children).
                                          super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data + 8),
             *(int *)(lVar5 + 0x10) == 6)) &&
            (bVar6 = settings::find(*(char **)(*(long *)(lVar5 + 8) + 0x10),
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)settings::function_can_return_string_abi_cxx11_), bVar6)) {
      return true;
    }
  }
LAB_0011fd08:
  uVar4 = ((long)nearest_assignments.
                 super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)nearest_assignments.
                super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar5 = (uVar4 & 0xffffffff) * 0x18;
  while( true ) {
    if ((int)uVar4 < 1) {
      return false;
    }
    pNVar2 = *(Node **)((long)&nearest_assignments.
                               super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar5);
    if ((pNVar2 != (Node *)0x0) && (bVar6 = isNodeEquals(this,a,pNVar2), bVar6)) break;
    uVar4 = (ulong)((int)uVar4 - 1);
    lVar5 = lVar5 + -0x18;
  }
  return *(int *)(*(long *)((long)nearest_assignments.
                                  super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x10) + 0x10)
         == 5;
}

Assistant:

bool isVarCanBeString(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_STRING)
      return true;

    if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NULLCOALESCE &&
      node->children[0]->nodeType == PNT_STRING)
    {
      return isVarCanBeString(node->children[0]);
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_ACCESS_MEMBER &&
      node->children[0]->children[1]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->children[1]->tok.u.s;
      if (settings::find(fnName, settings::function_can_return_string))
        return true;
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->tok.u.s;
      if (
        !strcmp(fnName, "loc")
        )
      {
        return true;
      }
    }



    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_STRING)
          return true;
        break;
      }

    return false;
  }